

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O0

LinkedSymbol __thiscall
HuffmanTable::getLeastWeightLinkedSymbol
          (HuffmanTable *this,vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *symbols)

{
  ulong uVar1;
  size_type this_00;
  size_type sVar2;
  reference pvVar3;
  LinkedSymbol LVar4;
  __normal_iterator<LinkedSymbol_*,_std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>_>
  local_50;
  __normal_iterator<LinkedSymbol_*,_std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>_>
  local_48;
  const_iterator local_40;
  ulong local_38;
  size_type i;
  size_type index;
  vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *symbols_local;
  HuffmanTable *this_local;
  value_type minWeight;
  
  index = (size_type)symbols;
  symbols_local = (vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *)this;
  sVar2 = std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>::size(symbols);
  i = sVar2 - 1;
  pvVar3 = std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>::operator[]
                     ((vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *)index,i);
  this_local = *(HuffmanTable **)pvVar3;
  minWeight._0_8_ = pvVar3->symbol;
  local_38 = std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>::size
                       ((vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *)index);
  while( true ) {
    local_38 = local_38 - 1;
    uVar1 = local_38;
    sVar2 = std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>::size
                      ((vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *)index);
    this_00 = index;
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>::operator[]
                       ((vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *)index,local_38);
    if (pvVar3->weight < (uint)this_local) {
      pvVar3 = std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>::operator[]
                         ((vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *)index,local_38);
      this_local = *(HuffmanTable **)pvVar3;
      minWeight._0_8_ = pvVar3->symbol;
      i = local_38;
    }
  }
  local_50._M_current =
       (LinkedSymbol *)
       std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>::begin
                 ((vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *)index);
  local_48 = __gnu_cxx::
             __normal_iterator<LinkedSymbol_*,_std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>_>
             ::operator+(&local_50,i);
  __gnu_cxx::
  __normal_iterator<LinkedSymbol_const*,std::vector<LinkedSymbol,std::allocator<LinkedSymbol>>>::
  __normal_iterator<LinkedSymbol*>
            ((__normal_iterator<LinkedSymbol_const*,std::vector<LinkedSymbol,std::allocator<LinkedSymbol>>>
              *)&local_40,&local_48);
  std::vector<LinkedSymbol,_std::allocator<LinkedSymbol>_>::erase
            ((vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *)this_00,local_40);
  LVar4._0_8_ = (ulong)this_local & 0xffffffff;
  LVar4.symbol = (Symbol *)minWeight._0_8_;
  return LVar4;
}

Assistant:

LinkedSymbol getLeastWeightLinkedSymbol(std::vector<LinkedSymbol>& symbols) {
            std::vector<LinkedSymbol>::size_type index = symbols.size() - 1;
            auto minWeight = symbols[index];
            //从底部开始循环
            for(auto i = symbols.size() - 1; i < symbols.size(); i--) {
                if(symbols[i].weight >= minWeight.weight) continue;
                minWeight = symbols[i];
                index = i;
            }
            symbols.erase(symbols.begin() + index);
            return minWeight;
    }